

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O0

int Dtc_ObjComputeTruth_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  uint local_2c;
  uint local_24;
  int Truth1;
  int Truth0;
  Gia_Obj_t *pObj_local;
  
  if (pObj->Value == 0) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFadds.c"
                    ,0x92,"int Dtc_ObjComputeTruth_rec(Gia_Obj_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    local_24 = Dtc_ObjComputeTruth_rec(pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    local_2c = Dtc_ObjComputeTruth_rec(pGVar2);
    iVar1 = Gia_ObjFaninC0(pObj);
    if (iVar1 != 0) {
      local_24 = local_24 ^ 0xffffffff;
    }
    iVar1 = Gia_ObjFaninC1(pObj);
    if (iVar1 != 0) {
      local_2c = local_2c ^ 0xffffffff;
    }
    pObj_local._4_4_ = local_24 & local_2c;
    pObj->Value = pObj_local._4_4_;
  }
  else {
    pObj_local._4_4_ = pObj->Value;
  }
  return pObj_local._4_4_;
}

Assistant:

int Dtc_ObjComputeTruth_rec( Gia_Obj_t * pObj )
{
    int Truth0, Truth1;
    if ( pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Truth0 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin0(pObj) );
    Truth1 = Dtc_ObjComputeTruth_rec( Gia_ObjFanin1(pObj) );
    return (pObj->Value = (Gia_ObjFaninC0(pObj) ? ~Truth0 : Truth0) & (Gia_ObjFaninC1(pObj) ? ~Truth1 : Truth1));
}